

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void __thiscall empty_messages_empty::test_method(empty_messages_empty *this)

{
  unit_test_log_t *puVar1;
  bool bVar2;
  lazy_ostream *plVar3;
  basic_cstring<const_char> local_148;
  basic_cstring<const_char> local_138;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
  local_128;
  undefined4 local_108;
  message_size local_104;
  undefined4 local_fd;
  binary_expr<boost::test_tools::assertion::value_expr<unsigned_int>,_int,_boost::test_tools::assertion::op::EQ<unsigned_int,_int,_void>_>
  local_f8;
  assertion_result local_f0;
  basic_cstring<const_char> local_d8;
  basic_cstring<const_char> local_c8;
  basic_cstring<const_char> local_b8;
  basic_cstring<const_char> local_a8 [2];
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
  local_88;
  undefined4 local_68;
  message_size local_64;
  undefined4 local_5d;
  binary_expr<boost::test_tools::assertion::value_expr<unsigned_int>,_int,_boost::test_tools::assertion::op::EQ<unsigned_int,_int,_void>_>
  local_58;
  assertion_result local_50;
  basic_cstring<const_char> local_38;
  basic_cstring<const_char> local_28;
  empty_message<(message_id)2> local_12;
  empty_message<(message_id)3> local_11;
  nop_message nop;
  empty_messages_empty *peStack_10;
  ping_message ping;
  empty_messages_empty *this_local;
  
  peStack_10 = this;
  do {
    puVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_28,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Stazer[P]autonomouscabs/test/cpp/main.cpp"
               ,0x60);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_38);
    boost::unit_test::unit_test_log_t::set_checkpoint(puVar1,&local_28,0x7f,&local_38);
    local_64 = empty_message<(message_id)2>::body_size(&local_12);
    boost::test_tools::assertion::seed::operator->*((seed *)((long)&local_5d + 1),&local_5d);
    local_68 = 0;
    boost::test_tools::assertion::
    expression_base<boost::test_tools::assertion::value_expr<unsigned_int>,unsigned_int>::operator==
              ((expression_base<boost::test_tools::assertion::value_expr<unsigned_int>,unsigned_int>
                *)&local_58,(int *)((long)&local_5d + 1));
    boost::test_tools::assertion::
    binary_expr<boost::test_tools::assertion::value_expr<unsigned_int>,_int,_boost::test_tools::assertion::op::EQ<unsigned_int,_int,_void>_>
    ::evaluate(&local_50,&local_58,false);
    plVar3 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (local_a8,"nop.body_size() == 0",0x14);
    boost::unit_test::operator<<(&local_88,plVar3,local_a8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_b8,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Stazer[P]autonomouscabs/test/cpp/main.cpp"
               ,0x60);
    boost::test_tools::tt_detail::report_assertion
              (&local_50,&local_88.super_lazy_ostream,&local_b8,0x7f,CHECK,CHECK_BUILT_ASSERTION,0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(&local_88);
    boost::test_tools::assertion_result::~assertion_result(&local_50);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    puVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_c8,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Stazer[P]autonomouscabs/test/cpp/main.cpp"
               ,0x60);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_d8);
    boost::unit_test::unit_test_log_t::set_checkpoint(puVar1,&local_c8,0x80,&local_d8);
    local_104 = empty_message<(message_id)3>::body_size(&local_11);
    boost::test_tools::assertion::seed::operator->*((seed *)((long)&local_fd + 1),&local_fd);
    local_108 = 0;
    boost::test_tools::assertion::
    expression_base<boost::test_tools::assertion::value_expr<unsigned_int>,unsigned_int>::operator==
              ((expression_base<boost::test_tools::assertion::value_expr<unsigned_int>,unsigned_int>
                *)&local_f8,(int *)((long)&local_fd + 1));
    boost::test_tools::assertion::
    binary_expr<boost::test_tools::assertion::value_expr<unsigned_int>,_int,_boost::test_tools::assertion::op::EQ<unsigned_int,_int,_void>_>
    ::evaluate(&local_f0,&local_f8,false);
    plVar3 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_138,"ping.body_size() == 0",0x15);
    boost::unit_test::operator<<(&local_128,plVar3,&local_138);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_148,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Stazer[P]autonomouscabs/test/cpp/main.cpp"
               ,0x60);
    boost::test_tools::tt_detail::report_assertion
              (&local_f0,&local_128.super_lazy_ostream,&local_148,0x80,CHECK,CHECK_BUILT_ASSERTION,0
              );
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(&local_128);
    boost::test_tools::assertion_result::~assertion_result(&local_f0);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(empty_messages_empty)
{
    ping_message ping;
    nop_message nop;

    BOOST_TEST(nop.body_size() == 0);
    BOOST_TEST(ping.body_size() == 0);
}